

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseExternalSubset(xmlParserCtxtPtr ctxt,xmlChar *ExternalID,xmlChar *SystemID)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlParserInputPtr pxVar3;
  xmlDocPtr pxVar4;
  xmlDtdPtr pxVar5;
  
  xmlCtxtInitializeLate(ctxt);
  xmlDetectEncoding(ctxt);
  pxVar2 = ctxt->input->cur;
  if ((((*pxVar2 == '<') && (pxVar2[1] == '?')) && (pxVar2[2] == 'x')) &&
     ((pxVar2[3] == 'm' && (pxVar2[4] == 'l')))) {
    xmlParseTextDecl(ctxt);
  }
  if (ctxt->myDoc == (xmlDocPtr)0x0) {
    pxVar4 = xmlNewDoc("1.0");
    ctxt->myDoc = pxVar4;
    if (pxVar4 == (xmlDocPtr)0x0) {
      xmlCtxtErrMemory(ctxt);
      return;
    }
    pxVar4->properties = 0x40;
  }
  pxVar4 = ctxt->myDoc;
  if (((pxVar4 != (xmlDocPtr)0x0) && (pxVar4->intSubset == (_xmlDtd *)0x0)) &&
     (pxVar5 = xmlCreateIntSubset(pxVar4,(xmlChar *)0x0,ExternalID,SystemID),
     pxVar5 == (xmlDtdPtr)0x0)) {
    xmlCtxtErrMemory(ctxt);
  }
  ctxt->inSubset = 2;
  iVar1 = ctxt->inputNr;
  xmlSkipBlankCharsPE(ctxt);
  while( true ) {
    pxVar3 = ctxt->input;
    if (((*pxVar3->cur == '\0') && (ctxt->inputNr <= iVar1)) || (1 < ctxt->disableSAX)) {
      while (iVar1 < ctxt->inputNr) {
        xmlPopPE(ctxt);
      }
      if (*ctxt->input->cur == '\0') {
        return;
      }
      xmlFatalErr(ctxt,XML_ERR_EXT_SUBSET_NOT_FINISHED,(char *)0x0);
      return;
    }
    if (((pxVar3->flags & 0x40) == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    pxVar2 = ctxt->input->cur;
    if (*pxVar2 != '<') break;
    if ((pxVar2[1] == '!') && (pxVar2[2] == '[')) {
      xmlParseConditionalSections(ctxt);
    }
    else {
      if ((pxVar2[1] != '?') && (pxVar2[1] != '!')) break;
      xmlParseMarkupDecl(ctxt);
    }
    xmlSkipBlankCharsPE(ctxt);
    if ((ctxt->input->flags & 0x40) == 0) {
      xmlParserShrink(ctxt);
    }
  }
  xmlFatalErr(ctxt,XML_ERR_EXT_SUBSET_NOT_FINISHED,(char *)0x0);
  xmlHaltParser(ctxt);
  return;
}

Assistant:

void
xmlParseExternalSubset(xmlParserCtxtPtr ctxt, const xmlChar *ExternalID,
                       const xmlChar *SystemID) {
    int oldInputNr;

    xmlCtxtInitializeLate(ctxt);

    xmlDetectEncoding(ctxt);

    if (CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) {
	xmlParseTextDecl(ctxt);
    }
    if (ctxt->myDoc == NULL) {
        ctxt->myDoc = xmlNewDoc(BAD_CAST "1.0");
	if (ctxt->myDoc == NULL) {
	    xmlErrMemory(ctxt);
	    return;
	}
	ctxt->myDoc->properties = XML_DOC_INTERNAL;
    }
    if ((ctxt->myDoc != NULL) && (ctxt->myDoc->intSubset == NULL) &&
        (xmlCreateIntSubset(ctxt->myDoc, NULL, ExternalID, SystemID) == NULL)) {
        xmlErrMemory(ctxt);
    }

    ctxt->inSubset = 2;
    oldInputNr = ctxt->inputNr;

    SKIP_BLANKS_PE;
    while (((RAW != 0) || (ctxt->inputNr > oldInputNr)) &&
           (!PARSER_STOPPED(ctxt))) {
	GROW;
        if ((RAW == '<') && (NXT(1) == '!') && (NXT(2) == '[')) {
            xmlParseConditionalSections(ctxt);
        } else if ((RAW == '<') && ((NXT(1) == '!') || (NXT(1) == '?'))) {
            xmlParseMarkupDecl(ctxt);
        } else {
            xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
            xmlHaltParser(ctxt);
            return;
        }
        SKIP_BLANKS_PE;
        SHRINK;
    }

    while (ctxt->inputNr > oldInputNr)
        xmlPopPE(ctxt);

    if (RAW != 0) {
	xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
    }
}